

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

void __thiscall
CCoinsViewCache::EmplaceCoinInternalDANGER(CCoinsViewCache *this,COutPoint *outpoint,Coin *coin)

{
  byte bVar1;
  ulong uVar2;
  _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> _Var3;
  ulong uVar4;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar5;
  COutPoint *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (ulong)(coin->out).scriptPubKey.super_CScriptBase._union.indirect_contents.capacity;
  if ((coin->out).scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar4 = 0;
  }
  uVar2 = 0;
  if ((int)uVar4 != 0) {
    uVar2 = uVar4 + 0x1f & 0xfffffffffffffff0;
  }
  this->cachedCoinsUsage = this->cachedCoinsUsage + uVar2;
  local_18 = outpoint;
  pVar5 = std::
          _Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::piecewise_construct_t_const&,std::tuple<COutPoint&&>,std::tuple<Coin&&>>
                    ((_Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->cacheCoins,&std::piecewise_construct,&local_18);
  _Var3 = pVar5.first.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    bVar1 = *(byte *)((long)_Var3.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x40);
    if (bVar1 == 0) {
      *(CoinsCachePair **)
       ((long)_Var3.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur + 0x30) = (this->m_sentinel).second.m_prev;
      *(CoinsCachePair **)
       ((long)_Var3.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur + 0x38) = &this->m_sentinel;
      (this->m_sentinel).second.m_prev =
           (CoinsCachePair *)
           ((long)_Var3.
                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                  _M_cur + 8);
      *(CoinsCachePair **)
       (*(long *)((long)_Var3.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 0x30) + 0x30) =
           (CoinsCachePair *)
           ((long)_Var3.
                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                  _M_cur + 8);
    }
    *(byte *)((long)_Var3.
                    super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                    _M_cur + 0x40) = bVar1 | 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewCache::EmplaceCoinInternalDANGER(COutPoint&& outpoint, Coin&& coin) {
    cachedCoinsUsage += coin.DynamicMemoryUsage();
    auto [it, inserted] = cacheCoins.emplace(
        std::piecewise_construct,
        std::forward_as_tuple(std::move(outpoint)),
        std::forward_as_tuple(std::move(coin)));
    if (inserted) {
        it->second.AddFlags(CCoinsCacheEntry::DIRTY, *it, m_sentinel);
    }
}